

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O3

int egg_type_from_parent(int mnum,boolean force_ordinary)

{
  uint uVar1;
  int iVar2;
  
  if ((((force_ordinary != '\0') ||
       (uVar1 = mt_random(), iVar2 = mnum, 0x3531dec < uVar1 * 0x3f2b3885)) &&
      (iVar2 = 1, mnum != 6)) && (iVar2 = 0x2a, mnum != 0x2b)) {
    iVar2 = mnum;
  }
  return iVar2;
}

Assistant:

int egg_type_from_parent(int mnum, /* parent monster; caller must handle lays_eggs() check */
			 boolean force_ordinary)
{
    if (force_ordinary || !BREEDER_EGG) {
	if (mnum == PM_QUEEN_BEE) mnum = PM_KILLER_BEE;
	else if (mnum == PM_WINGED_GARGOYLE) mnum = PM_GARGOYLE;
    }
    return mnum;
}